

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

void ini_section_name_set(ini_t *ini,int section,char *name,int length)

{
  char *pcVar1;
  ini_internal_section_t *piVar2;
  size_t __n;
  
  if ((((-1 < section) && (ini != (ini_t *)0x0)) && (name != (char *)0x0)) &&
     (section < ini->section_count)) {
    if (length < 1) {
      length = sx_strlen(name);
    }
    piVar2 = ini->sections;
    if (piVar2[(uint)section].name_large != (char *)0x0) {
      (**ini->memctx)(piVar2[(uint)section].name_large,0,0,0,0,0,
                      *(undefined8 *)((long)ini->memctx + 8));
      piVar2 = ini->sections;
    }
    piVar2[(uint)section].name_large = (char *)0x0;
    if (length - 0x1fU < 0xffffffe0) {
      __n = (size_t)length;
      pcVar1 = (char *)(**ini->memctx)(0,__n + 1,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      ini->sections[(uint)section].name_large = pcVar1;
      memcpy(pcVar1,name,__n);
      pcVar1 = ini->sections[(uint)section].name_large + __n;
    }
    else {
      memcpy(piVar2 + (uint)section,name,(long)length);
      pcVar1 = ini->sections[(uint)section].name + length;
    }
    *pcVar1 = '\0';
  }
  return;
}

Assistant:

void ini_section_name_set( ini_t* ini, int section, char const* name, int length )
    {
    if( ini && name && section >= 0 && section < ini->section_count )
        {
        if( length <= 0 ) length = (int) INI_STRLEN( name );
        if( ini->sections[ section ].name_large ) INI_FREE( ini->memctx, ini->sections[ section ].name_large );
        ini->sections[ section ].name_large = 0;
        
        if( length + 1 >= sizeof( ini->sections[ 0 ].name ) )
            {
            ini->sections[ section ].name_large = (char*) INI_MALLOC( ini->memctx, (size_t) length + 1 );
            INI_MEMCPY( ini->sections[ section ].name_large, name, (size_t) length );
            ini->sections[ section ].name_large[ length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->sections[ section ].name, name, (size_t) length );
            ini->sections[ section ].name[ length ] = '\0';
            }
        }
    }